

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyReceivedPdu.cpp
# Opt level: O0

int __thiscall DIS::ResupplyReceivedPdu::getMarshalledSize(ResupplyReceivedPdu *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined1 local_40 [8];
  SupplyQuantity listElement;
  unsigned_long_long idx;
  int marshalSize;
  ResupplyReceivedPdu *this_local;
  
  iVar2 = LogisticsFamilyPdu::getMarshalledSize(&this->super_LogisticsFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_receivingEntityID);
  iVar4 = EntityID::getMarshalledSize(&this->_supplyingEntityID);
  idx._4_4_ = iVar2 + iVar3 + iVar4 + 4;
  listElement._quantity = 0.0;
  listElement._28_4_ = 0;
  while( true ) {
    uVar1 = listElement._24_8_;
    sVar5 = std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::size
                      (&this->_supplies);
    if (sVar5 <= (ulong)uVar1) break;
    pvVar6 = std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::operator[]
                       (&this->_supplies,listElement._24_8_);
    SupplyQuantity::SupplyQuantity((SupplyQuantity *)local_40,pvVar6);
    iVar2 = SupplyQuantity::getMarshalledSize((SupplyQuantity *)local_40);
    idx._4_4_ = idx._4_4_ + iVar2;
    SupplyQuantity::~SupplyQuantity((SupplyQuantity *)local_40);
    listElement._24_8_ = listElement._24_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int ResupplyReceivedPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = LogisticsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _receivingEntityID.getMarshalledSize();  // _receivingEntityID
   marshalSize = marshalSize + _supplyingEntityID.getMarshalledSize();  // _supplyingEntityID
   marshalSize = marshalSize + 1;  // _numberOfSupplyTypes
   marshalSize = marshalSize + 2;  // _padding1
   marshalSize = marshalSize + 1;  // _padding2

   for(unsigned long long idx=0; idx < _supplies.size(); idx++)
   {
        SupplyQuantity listElement = _supplies[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}